

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O1

void ft_stroke_border_close(SW_FT_StrokeBorder border,SW_FT_Bool reverse)

{
  uint uVar1;
  SW_FT_Byte SVar2;
  uint uVar3;
  uint uVar4;
  SW_FT_Pos SVar5;
  SW_FT_Pos SVar6;
  SW_FT_Pos SVar7;
  SW_FT_Byte *pSVar8;
  SW_FT_Vector *pSVar9;
  SW_FT_Byte *pSVar10;
  SW_FT_Vector *pSVar11;
  bool bVar12;
  SW_FT_Vector tmp;
  
  uVar3 = border->num_points;
  uVar4 = border->start;
  if (uVar4 + 1 < uVar3) {
    uVar1 = uVar3 - 1;
    border->num_points = uVar1;
    pSVar11 = border->points + uVar1;
    SVar5 = pSVar11->y;
    pSVar9 = border->points + uVar4;
    pSVar9->x = pSVar11->x;
    pSVar9->y = SVar5;
    if (reverse != '\0') {
      pSVar11 = border->points;
      pSVar9 = pSVar11 + (ulong)uVar4 + 1;
      if (pSVar9 < pSVar11 + ((ulong)uVar1 - 1)) {
        pSVar11 = pSVar11 + ((ulong)uVar1 - 2);
        do {
          SVar5 = pSVar9->x;
          SVar6 = pSVar9->y;
          SVar7 = pSVar11[1].y;
          pSVar9->x = pSVar11[1].x;
          pSVar9->y = SVar7;
          pSVar11[1].x = SVar5;
          pSVar11[1].y = SVar6;
          pSVar9 = pSVar9 + 1;
          bVar12 = pSVar9 < pSVar11;
          pSVar11 = pSVar11 + -1;
        } while (bVar12);
      }
      pSVar8 = border->tags;
      pSVar10 = pSVar8 + (ulong)uVar4 + 1;
      if (pSVar10 < pSVar8 + ((ulong)uVar1 - 1)) {
        pSVar8 = pSVar8 + ((ulong)uVar1 - 2);
        do {
          SVar2 = *pSVar10;
          *pSVar10 = pSVar8[1];
          pSVar8[1] = SVar2;
          pSVar10 = pSVar10 + 1;
          bVar12 = pSVar10 < pSVar8;
          pSVar8 = pSVar8 + -1;
        } while (bVar12);
      }
    }
    border->tags[uVar4] = border->tags[uVar4] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar4;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void ft_stroke_border_close(SW_FT_StrokeBorder border,
                                   SW_FT_Bool         reverse)
{
    SW_FT_UInt start = border->start;
    SW_FT_UInt count = border->num_points;

    assert(border->start >= 0);

    /* don't record empty paths! */
    if (count <= start + 1U)
        border->num_points = start;
    else {
        /* copy the last point to the start of this sub-path, since */
        /* it contains the `adjusted' starting coordinates          */
        border->num_points = --count;
        border->points[start] = border->points[count];

        if (reverse) {
            /* reverse the points */
            {
                SW_FT_Vector* vec1 = border->points + start + 1;
                SW_FT_Vector* vec2 = border->points + count - 1;

                for (; vec1 < vec2; vec1++, vec2--) {
                    SW_FT_Vector tmp;

                    tmp = *vec1;
                    *vec1 = *vec2;
                    *vec2 = tmp;
                }
            }

            /* then the tags */
            {
                SW_FT_Byte* tag1 = border->tags + start + 1;
                SW_FT_Byte* tag2 = border->tags + count - 1;

                for (; tag1 < tag2; tag1++, tag2--) {
                    SW_FT_Byte tmp;

                    tmp = *tag1;
                    *tag1 = *tag2;
                    *tag2 = tmp;
                }
            }
        }

        border->tags[start] |= SW_FT_STROKE_TAG_BEGIN;
        border->tags[count - 1] |= SW_FT_STROKE_TAG_END;
    }

    border->start = -1;
    border->movable = FALSE;
}